

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_avx2.c
# Opt level: O0

void cfl_luma_subsampling_422_hbd_avx2
               (uint16_t *input,int input_stride,uint16_t *pred_buf_q3,int width,int height)

{
  undefined1 auVar1 [32];
  undefined8 *in_RDX;
  int in_ESI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  __m256i hsum;
  __m256i top_1;
  __m256i top;
  __m256i *row_end;
  __m256i *row;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 *local_118;
  undefined1 (*local_f8) [32];
  
  local_118 = in_RDX;
  local_f8 = in_RDI;
  do {
    auVar1 = vphaddw_avx2(*local_f8,local_f8[1]);
    auVar1 = vpermq_avx2(auVar1,0xd8);
    auVar1 = vpsllw_avx2(auVar1,ZEXT416(2));
    local_180 = auVar1._0_8_;
    uStack_178 = auVar1._8_8_;
    uStack_170 = auVar1._16_8_;
    uStack_168 = auVar1._24_8_;
    *local_118 = local_180;
    local_118[1] = uStack_178;
    local_118[2] = uStack_170;
    local_118[3] = uStack_168;
    local_f8 = (undefined1 (*) [32])(*local_f8 + (long)in_ESI * 2);
    local_118 = local_118 + 8;
  } while (local_118 < in_RDX + (long)(in_R8D << 1) * 4);
  return;
}

Assistant:

static void cfl_luma_subsampling_422_hbd_avx2(const uint16_t *input,
                                              int input_stride,
                                              uint16_t *pred_buf_q3, int width,
                                              int height) {
  (void)width;  // Forever 32
  __m256i *row = (__m256i *)pred_buf_q3;
  const __m256i *row_end = row + height * CFL_BUF_LINE_I256;
  do {
    __m256i top = _mm256_loadu_si256((__m256i *)input);
    __m256i top_1 = _mm256_loadu_si256((__m256i *)(input + 16));
    __m256i hsum = _mm256_hadd_epi16(top, top_1);
    hsum = _mm256_permute4x64_epi64(hsum, _MM_SHUFFLE(3, 1, 2, 0));
    hsum = _mm256_slli_epi16(hsum, 2);

    _mm256_storeu_si256(row, hsum);

    input += input_stride;
  } while ((row += CFL_BUF_LINE_I256) < row_end);
}